

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_SpawnSpecials(void)

{
  line_t_conflict *line_00;
  line_t_conflict *plVar1;
  uint uVar2;
  uint uVar3;
  DThinker *origin;
  DLightTransfer *pDVar4;
  DWallLightTransfer *this;
  bool tolines;
  ushort uVar5;
  sector_t_conflict *psVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  undefined8 in_RSI;
  line_t_conflict *line;
  int *piVar10;
  double dVar11;
  FSectorTagIterator itr;
  sector_t_conflict *local_58;
  double local_50;
  TThinkerIterator<ASkyCamCompat> it2;
  
  P_SetupPortals();
  psVar6 = sectors;
  iVar9 = numsectors;
  for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
    if (psVar6->special != 0) {
      P_InitSectorSpecial((sector_t *)psVar6,(int)in_RSI);
      iVar9 = numsectors;
    }
    psVar6 = psVar6 + 1;
  }
  ProcessEDSectors();
  P_SpawnScrollers();
  piVar10 = lines->args + 1;
  iVar9 = numlines;
  for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
    if (piVar10[-2] == 0xdb) {
      iVar9 = *piVar10;
      if (iVar9 == 0) {
        it2.super_FThinkerIterator.m_ParentType = (PClass *)((DVector2 *)(piVar10 + -8))->X;
        it2.super_FThinkerIterator.m_CurrThinker = *(DThinker **)(piVar10 + -6);
        dVar11 = TVector2<double>::Length((TVector2<double> *)&it2);
        iVar9 = (int)dVar11;
      }
      else if (199 < iVar9) {
        iVar9 = 200;
      }
      P_SetSectorFriction(piVar10[-1],iVar9,false);
      piVar10[-2] = 0;
      iVar9 = numlines;
    }
    piVar10 = piVar10 + 0x26;
  }
  P_SpawnPushers();
  TThinkerIterator<ASkyCamCompat>::TThinkerIterator
            ((TThinkerIterator<ASkyCamCompat> *)&it2.super_FThinkerIterator,0x80);
  while (origin = FThinkerIterator::Next(&it2.super_FThinkerIterator,false),
        origin != (DThinker *)0x0) {
    P_SpawnSkybox((ASkyViewpoint *)origin);
  }
  for (lVar7 = 0; plVar1 = lines, lVar7 < numlines; lVar7 = lVar7 + 1) {
    iVar9 = lines[lVar7].special;
    if (iVar9 == 0x10) {
      this = (DWallLightTransfer *)DObject::operator_new(0x48);
      DWallLightTransfer::DWallLightTransfer
                (this,(sector_t *)lines[lVar7].frontsector,lines[lVar7].args[0],
                 (BYTE)lines[lVar7].args[1]);
    }
    else {
      line_00 = lines + lVar7;
      if (iVar9 == 0x30) {
        P_Attach3dMidtexLinesToSector
                  (line_00->frontsector,line_00->args[0],line_00->args[1],line_00->args[2] != 0);
      }
      else if (iVar9 == 0x33) {
        if (line_00->args[0] == 0) {
          P_AddSectorLinks(line_00->frontsector,line_00->args[1],line_00->args[2],line_00->args[3]);
        }
      }
      else if (iVar9 == 0x39) {
        iVar9 = line_00->args[1];
        if (((iVar9 == 6) || (iVar9 == 0)) && (line_00->args[3] == 0)) {
          P_SpawnPortal(line_00,line_00->args[0],line_00->args[2],line_00->args[4],iVar9);
        }
        else if (iVar9 - 3U < 2) {
          itr.searchtag = 0;
          itr.start = 0;
          tolines = false;
          uVar2 = P_GetPortal(iVar9 == 3 ^ 5,line_00->args[2],line_00->frontsector,
                              (sector_t_conflict *)0x0,(DVector2 *)&itr);
          CopyPortal(line_00->args[0],line_00->args[2],uVar2,0.0,tolines);
        }
      }
      else if (iVar9 == 0x9c) {
        P_SpawnLinePortal(line_00);
      }
      else if (iVar9 == 0xbe) {
        iVar9 = line_00->args[1];
        if (iVar9 == 0xff) {
          itr.searchtag = lines[lVar7].args[0];
          if (itr.searchtag == 0) {
            itr.start = 0;
          }
          else {
            itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
          }
          while (uVar2 = FSectorTagIterator::Next(&itr), -1 < (int)uVar2) {
            sectors[uVar2].sky = (int)lVar7 + 1U | 0x40000000;
          }
        }
        else if (iVar9 == 2) {
          itr = (FSectorTagIterator)(line_00->delta).X;
          dVar11 = TVector2<double>::Length((TVector2<double> *)&itr);
          itr.searchtag = lines[lVar7].args[0];
          if (itr.searchtag == 0) {
            itr.start = 0;
          }
          else {
            itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
          }
          uVar2 = (uint)dVar11;
          while (uVar3 = FSectorTagIterator::Next(&itr), psVar6 = sectors, -1 < (int)uVar3) {
            sectors[uVar3].damagetype.super_FName.Index = 0;
            psVar6[uVar3].damageamount = uVar2;
            if ((int)uVar2 < 0x14) {
              psVar6[uVar3].damageinterval = 0x20;
              psVar6[uVar3].leakydamage = 0;
            }
            else if (uVar2 < 0x32) {
              psVar6[uVar3].damageinterval = 0x20;
              psVar6[uVar3].leakydamage = 5;
            }
            else {
              psVar6[uVar3].damageinterval = 1;
              psVar6[uVar3].leakydamage = 0x100;
            }
          }
        }
        else if (iVar9 == 3) {
          if (line_00->args[3] == 0) {
            P_AddSectorLinksByID(line_00->frontsector,line_00->args[0],line_00->args[2]);
          }
        }
        else if (iVar9 == 0) {
          itr = (FSectorTagIterator)(line_00->delta).X;
          local_50 = TVector2<double>::Length((TVector2<double> *)&itr);
          local_50 = local_50 / 100.0;
          itr.searchtag = lines[lVar7].args[0];
          if (itr.searchtag == 0) {
            itr.start = 0;
          }
          else {
            itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
          }
          while (uVar2 = FSectorTagIterator::Next(&itr), -1 < (int)uVar2) {
            sectors[uVar2].gravity = local_50;
          }
        }
      }
      else if (iVar9 == 0xd3) {
        pDVar4 = (DLightTransfer *)DObject::operator_new(0x48);
        DLightTransfer::DLightTransfer
                  (pDVar4,(sector_t *)lines[lVar7].frontsector,lines[lVar7].args[0],false);
      }
      else if (iVar9 == 0xd2) {
        pDVar4 = (DLightTransfer *)DObject::operator_new(0x48);
        DLightTransfer::DLightTransfer
                  (pDVar4,(sector_t *)lines[lVar7].frontsector,lines[lVar7].args[0],true);
      }
      else if (iVar9 == 0xd1) {
        psVar6 = line_00->frontsector;
        uVar2 = line_00->args[1];
        if ((uVar2 & 2) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 2;
        }
        if ((uVar2 & 4) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 4;
        }
        uVar5 = 0x20;
        if (((uVar2 & 8) != 0) || (uVar5 = 0x40, forcewater.Value == true)) {
          psVar6->MoreFlags = psVar6->MoreFlags | uVar5;
        }
        if ((uVar2 & 0x10) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 0x10;
        }
        if ((uVar2 & 0x20) != 0) {
          *(byte *)&psVar6->MoreFlags = (byte)psVar6->MoreFlags | 8;
        }
        itr.searchtag = plVar1[lVar7].args[0];
        if (itr.searchtag == 0) {
          itr.start = 0;
        }
        else {
          itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
        }
        while (uVar2 = FSectorTagIterator::Next(&itr), -1 < (int)uVar2) {
          sectors[uVar2].heightsec = psVar6;
          local_58 = sectors + uVar2;
          TArray<sector_t_*,_sector_t_*>::Push
                    ((TArray<sector_t_*,_sector_t_*> *)psVar6->e,&local_58);
          sector_t::AdjustFloorClip((sector_t *)(sectors + uVar2));
        }
      }
    }
  }
  FBehavior::StaticStartTypedScripts(1,(AActor *)0x0,false,0,false);
  return;
}

Assistant:

void P_SpawnSpecials (void)
{
	sector_t *sector;
	int i;

	P_SetupPortals();

	//	Init special SECTORs.
	sector = sectors;
	for (i = 0; i < numsectors; i++, sector++)
	{
		if (sector->special == 0)
			continue;

		P_InitSectorSpecial(sector, sector->special);
	}

#ifndef NO_EDATA
	ProcessEDSectors();
#endif

	
	// Init other misc stuff

	P_SpawnScrollers(); // killough 3/7/98: Add generalized scrollers
	P_SpawnFriction();	// phares 3/12/98: New friction model using linedefs
	P_SpawnPushers();	// phares 3/20/98: New pusher model using linedefs

	TThinkerIterator<ASkyCamCompat> it2;
	ASkyCamCompat *pt2;
	while ((pt2 = it2.Next()))
	{
		P_SpawnSkybox(pt2);
	}

	for (i = 0; i < numlines; i++)
	{
		switch (lines[i].special)
		{
			int s;
			sector_t *sec;

		// killough 3/7/98:
		// support for drawn heights coming from different sector
		case Transfer_Heights:
			{
				sec = lines[i].frontsector;
				if (lines[i].args[1] & 2)
				{
					sec->MoreFlags |= SECF_FAKEFLOORONLY;
				}
				if (lines[i].args[1] & 4)
				{
					sec->MoreFlags |= SECF_CLIPFAKEPLANES;
				}
				if (lines[i].args[1] & 8)
				{
					sec->MoreFlags |= SECF_UNDERWATER;
				}
				else if (forcewater)
				{
					sec->MoreFlags |= SECF_FORCEDUNDERWATER;
				}
				if (lines[i].args[1] & 16)
				{
					sec->MoreFlags |= SECF_IGNOREHEIGHTSEC;
				}
				if (lines[i].args[1] & 32)
				{
					sec->MoreFlags |= SECF_NOFAKELIGHT;
				}
				FSectorTagIterator itr(lines[i].args[0]);
				while ((s = itr.Next()) >= 0)
				{
					sectors[s].heightsec = sec;
					sec->e->FakeFloor.Sectors.Push(&sectors[s]);
					sectors[s].AdjustFloorClip();
				}
				break;
			}

		// killough 3/16/98: Add support for setting
		// floor lighting independently (e.g. lava)
		case Transfer_FloorLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], true);
			break;

		// killough 4/11/98: Add support for setting
		// ceiling lighting independently
		case Transfer_CeilingLight:
			new DLightTransfer (lines[i].frontsector, lines[i].args[0], false);
			break;

		// [Graf Zahl] Add support for setting lighting
		// per wall independently
		case Transfer_WallLight:
			new DWallLightTransfer (lines[i].frontsector, lines[i].args[0], lines[i].args[1]);
			break;

		case Sector_Attach3dMidtex:
			P_Attach3dMidtexLinesToSector(lines[i].frontsector, lines[i].args[0], lines[i].args[1], !!lines[i].args[2]);
			break;

		case Sector_SetLink:
			if (lines[i].args[0] == 0)
			{
				P_AddSectorLinks(lines[i].frontsector, lines[i].args[1], lines[i].args[2], lines[i].args[3]);
			}
			break;

		case Sector_SetPortal:
			// arg 0 = sector tag
			// arg 1 = type
			//	- 0: normal (handled here)
			//	- 1: copy (handled by the portal they copy)
			//	- 2: EE-style skybox (handled by the camera object)
			//  - 3: EE-style flat portal (GZDoom HW renderer only for now)
			//  - 4: EE-style horizon portal (GZDoom HW renderer only for now)
			//  - 5: copy portal to line (GZDoom HW renderer only for now)
			//  - 6: linked portal
			//	other values reserved for later use
			// arg 2 = 0:floor, 1:ceiling, 2:both
			// arg 3 = 0: anchor, 1: reference line
			// arg 4 = for the anchor only: alpha
			if ((lines[i].args[1] == 0 || lines[i].args[1] == 6) && lines[i].args[3] == 0)
			{
				P_SpawnPortal(&lines[i], lines[i].args[0], lines[i].args[2], lines[i].args[4], lines[i].args[1]);
			}
			else if (lines[i].args[1] == 3 || lines[i].args[1] == 4)
			{
				line_t *line = &lines[i];
				unsigned pnum = P_GetPortal(line->args[1] == 3 ? PORTS_PLANE : PORTS_HORIZON, line->args[2], line->frontsector, NULL, { 0,0 });
				CopyPortal(line->args[0], line->args[2], pnum, 0, true);
			}
			break;

		case Line_SetPortal:
			P_SpawnLinePortal(&lines[i]);
			break;

		// [RH] ZDoom Static_Init settings
		case Static_Init:
			switch (lines[i].args[1])
			{
			case Init_Gravity:
				{
					double grav = lines[i].Delta().Length() / 100.;
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						sectors[s].gravity = grav;
				}
				break;

			//case Init_Color:
			// handled in P_LoadSideDefs2()

			case Init_Damage:
				{
					int damage = int(lines[i].Delta().Length());
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
					{
						sector_t *sec = &sectors[s];
						sec->damageamount = damage;
						sec->damagetype = NAME_None;
						if (sec->damageamount < 20)
						{
							sec->leakydamage = 0;
							sec->damageinterval = 32;
						}
						else if (sec->damageamount < 50)
						{
							sec->leakydamage = 5;
							sec->damageinterval = 32;
						}
						else
						{
							sec->leakydamage = 256;
							sec->damageinterval = 1;
						}
					}
				}
				break;

			case Init_SectorLink:
				if (lines[i].args[3] == 0)
					P_AddSectorLinksByID(lines[i].frontsector, lines[i].args[0], lines[i].args[2]);
				break;

			// killough 10/98:
			//
			// Support for sky textures being transferred from sidedefs.
			// Allows scrolling and other effects (but if scrolling is
			// used, then the same sector tag needs to be used for the
			// sky sector, the sky-transfer linedef, and the scroll-effect
			// linedef). Still requires user to use F_SKY1 for the floor
			// or ceiling texture, to distinguish floor and ceiling sky.

			case Init_TransferSky:
				{
					FSectorTagIterator itr(lines[i].args[0]);
					while ((s = itr.Next()) >= 0)
						 sectors[s].sky = (i + 1) | PL_SKYFLAT; 
					break;
				}
			}
			break;
		}
	}
	// [RH] Start running any open scripts on this map
	FBehavior::StaticStartTypedScripts (SCRIPT_Open, NULL, false);
}